

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QLoggingCategory_*,_QtMsgType>::emplace_helper<QtMsgType>
          (QHash<QLoggingCategory_*,_QtMsgType> *this,QLoggingCategory **key,QtMsgType *args)

{
  long lVar1;
  piter it;
  piter pVar2;
  Node<QLoggingCategory_*,_QtMsgType> *n;
  iterator<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> *in_RDX;
  QLoggingCategory **in_RSI;
  QLoggingCategory **in_RDI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  Data<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_> *in_stack_ffffffffffffffb8;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<QLoggingCategory*,QtMsgType>>::
  findOrInsert<QLoggingCategory*>(in_stack_ffffffffffffffb8,in_RDI);
  n = QHashPrivate::iterator<QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>_>::node(in_RDX);
  QHashPrivate::Node<QLoggingCategory_*,_QtMsgType>::createInPlace<QtMsgType>
            (n,in_RSI,(QtMsgType *)in_RDX);
  it.bucket = in_stack_ffffffffffffff98;
  it.d = in_stack_ffffffffffffff90;
  iterator::iterator(in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }